

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O2

int shm::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t __len;
  ostream *poVar4;
  ulong uVar5;
  void *__s;
  TemplateSHMException<1> *pTVar6;
  int *piVar7;
  char *pcVar8;
  TemplateSHMException<0> *pTVar9;
  void *in_RCX;
  char in_DL;
  size_t __len_00;
  ulong in_RSI;
  string local_408;
  float local_3e8;
  stringstream errstr;
  ostream local_3c0 [376];
  stringstream path;
  ostream local_238 [376];
  stat st;
  
  if (in_RSI == 0) {
    pTVar9 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&errstr,"nbytes cannot be zero when allocating memory!",(allocator *)&path)
    ;
    TemplateSHMException<0>::TemplateSHMException(pTVar9,(string *)&errstr);
    __cxa_throw(pTVar9,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
  }
  lVar3 = sysconf(0x55);
  __len = sysconf(0x1e);
  if (lVar3 * __len < in_RSI) {
    std::__cxx11::stringstream::stringstream((stringstream *)&errstr);
    poVar4 = std::operator<<(local_3c0,"You\'ve tried to allocate too many bytes (");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"),");
    poVar4 = std::operator<<(poVar4," the total possible is (");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4,")\n");
    pTVar9 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    TemplateSHMException<0>::TemplateSHMException(pTVar9,(string *)&path);
    __cxa_throw(pTVar9,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
  }
  local_3e8 = ceilf((float)in_RSI / (float)(long)__len);
  std::__cxx11::stringstream::stringstream((stringstream *)&path);
  poVar4 = std::operator<<(local_238,"/dev/shm/");
  std::operator<<(poVar4,(char *)ctx);
  std::__cxx11::stringbuf::str();
  iVar1 = stat(_errstr,(stat *)&st);
  std::__cxx11::string::~string((string *)&errstr);
  if (iVar1 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&errstr);
    poVar4 = std::operator<<(local_3c0,"SHM Handle already exists \"");
    poVar4 = std::operator<<(poVar4,(char *)ctx);
    std::operator<<(poVar4,"\" already exists, please use open\n");
    pTVar6 = (TemplateSHMException<1> *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    TemplateSHMException<1>::TemplateSHMException(pTVar6,&local_408);
    __cxa_throw(pTVar6,&TemplateSHMException<1>::typeinfo,SHMException::~SHMException);
  }
  iVar1 = shm_open((char *)ctx,0xc2,0x180);
  if (iVar1 != -1) {
    uVar5 = (ulong)(local_3e8 + 1.0);
    __len_00 = ((long)((local_3e8 + 1.0) - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5) * __len;
    iVar2 = ftruncate(iVar1,__len_00);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&errstr);
      poVar4 = std::operator<<(local_3c0,"Failed to truncate shm for file descriptor (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
      std::operator<<(poVar4,") ");
      poVar4 = std::operator<<(local_3c0,"with number of bytes (");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,").  Error code returned: ");
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      std::operator<<(local_3c0,pcVar8);
      shm_unlink((char *)ctx);
      pTVar9 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      TemplateSHMException<0>::TemplateSHMException(pTVar9,&local_408);
      __cxa_throw(pTVar9,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
    }
    __s = mmap(in_RCX,__len_00,3,1,iVar1,0);
    if (__s != (void *)0xffffffffffffffff) {
      if (in_DL != '\0') {
        memset(__s,0,in_RSI);
      }
      mprotect((void *)((long)__s + (__len_00 - __len)),__len,0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&path);
      return (int)__s;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&errstr);
    poVar4 = std::operator<<(local_3c0,"Failed to mmap shm region with the following error: ");
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    poVar4 = std::operator<<(poVar4,pcVar8);
    poVar4 = std::operator<<(poVar4,",\n");
    std::operator<<(poVar4,"unlinking.");
    shm_unlink((char *)ctx);
    pTVar9 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    TemplateSHMException<0>::TemplateSHMException(pTVar9,&local_408);
    __cxa_throw(pTVar9,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&errstr);
  piVar7 = __errno_location();
  if (*piVar7 == 0x11) {
    poVar4 = std::operator<<(local_3c0,"SHM Handle already exists \"");
    poVar4 = std::operator<<(poVar4,(char *)ctx);
    std::operator<<(poVar4,"\" already exists, please use open\n");
    pTVar6 = (TemplateSHMException<1> *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    TemplateSHMException<1>::TemplateSHMException(pTVar6,&local_408);
    __cxa_throw(pTVar6,&TemplateSHMException<1>::typeinfo,SHMException::~SHMException);
  }
  poVar4 = std::operator<<(local_3c0,"Failed to open shm with file descriptor \"");
  poVar4 = std::operator<<(poVar4,(char *)ctx);
  std::operator<<(poVar4,"\", error code returned: ");
  pcVar8 = strerror(*piVar7);
  std::operator<<(local_3c0,pcVar8);
  pTVar9 = (TemplateSHMException<0> *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  TemplateSHMException<0>::TemplateSHMException(pTVar9,&local_408);
  __cxa_throw(pTVar9,&TemplateSHMException<0>::typeinfo,SHMException::~SHMException);
}

Assistant:

void*
shm::init( const shm_key_t     &key,
           const std::size_t   nbytes,
           const bool zero   /* zero mem */,
           void   *ptr )
{
    auto handle_open_failure = [&]( const shm_key_t &key ) -> void*
    {
#if USE_CPP_EXCEPTIONS==1      
        std::stringstream ss;
#endif
        if( errno == EEXIST )
        {
#if USE_CPP_EXCEPTIONS==1      
            ss << "SHM Handle already exists \"" << key << "\" already exists, please use open\n";
            throw shm_already_exists( ss.str() );
#else            
            return( (void*)-1 );
#endif            
        }
        else 
        {
#if USE_CPP_EXCEPTIONS==1      
            ss << "Failed to open shm with file descriptor \"" << 
               key << "\", error code returned: ";
            ss << std::strerror( errno );
            throw bad_shm_alloc( ss.str() ); 
#else
            return( nullptr );
#endif
        }
    };

    if( nbytes == 0 )
    {
#if USE_CPP_EXCEPTIONS==1      
       throw bad_shm_alloc( "nbytes cannot be zero when allocating memory!" );
#else
        return( nullptr );
#endif
    }
    
    /** 
     * NOTE: 
     * - actual allocation size should be alloc_bytes,
     * user has no idea so we'll re-calc this at the  end
     * when we unmap the data.
     * - This is the same out that is returned at the end
     * for ease of keeping track of code between the two
     * different versions. 
     */
    void *out( nullptr );
    

    /**
     * NOTE: this is largely for truncation purposes,
     * but this is also needed as a sanity check and 
     * some off the values are needed elsewhere so let's
     * do this before we go into POSIX/SystemV specific 
     * code. 
     */
    const auto num_phys_pages( sysconf( _SC_PHYS_PAGES ) );
    const auto page_size( sysconf( _SC_PAGE_SIZE ) );
    const auto total_possible_bytes( num_phys_pages * page_size );
    if( nbytes > total_possible_bytes )
    {
    
#if USE_CPP_EXCEPTIONS==1      
         std::stringstream errstr;
         errstr << "You've tried to allocate too many bytes (" << nbytes << "),"
             << " the total possible is (" << total_possible_bytes << ")\n";
         throw bad_shm_alloc( errstr.str() ); 
#else
         //errno should be set (hopefully)
         return( nullptr );
#endif
    }
    /** get allocations size including extra dummy page **/
    const auto alloc_bytes( 
       static_cast< std::size_t >( 
          std::ceil(  
             static_cast< float >( nbytes) / 
            static_cast< float >( page_size ) ) + 1 /** one extra page for guard **/ ) * page_size 
    );
    
#if _USE_POSIX_SHM_ == 1
    int fd( shm::failure  );
    //stupid hack to get around platforms that are
    //using LD_PRELOAD, e.g., dynamic binary tools
    struct stat st;
    std::stringstream path;
    path << "/dev/shm/" << key;
    if( stat( path.str().c_str(), &st ) == 0 )
    {
#if USE_CPP_EXCEPTIONS==1      
        std::stringstream ss;
#endif
#if USE_CPP_EXCEPTIONS==1      
            ss << "SHM Handle already exists \"" << key << "\" already exists, please use open\n";
            throw shm_already_exists( ss.str() );
#else            
            return( (void*)-1 );
#endif            
    }
    
    /* set read/write set create if not exists */
    const std::int32_t flags( O_RDWR | O_CREAT | O_EXCL );
    /* set read/write by user */
    const mode_t mode( S_IWUSR | S_IRUSR );
    fd  = shm_open( key, 
                    flags, 
                    mode );
    if( fd == failure )
    {
        //if using exceptions you won't return
        return( handle_open_failure( key ) );
    }
    
    if( ftruncate( fd, alloc_bytes ) != shm::success )
    {
#if USE_CPP_EXCEPTIONS==1      
       std::stringstream ss;
       ss << "Failed to truncate shm for file descriptor (" << fd << ") ";
       ss << "with number of bytes (" << nbytes << ").  Error code returned: ";
       ss << std::strerror( errno );
       shm_unlink( key );
       throw bad_shm_alloc( ss.str() );
#else
       shm_unlink( key );
       return( nullptr );
#endif
    }

    /** 
     * NOTE: might be useful to change page size to something larger than default
     * for some applications. We'll add that as a future option, however, for now
     * I'll leave the note here.
     * flags = MAP_HUGETLB | MAP_ANONYMOUS | MAP_HUGE_2MB
     * flags = MAP_HUGETLB | MAP_ANONYMOUS | MAP_HUGE_1GB
     * we'll need to make sure huge pages are installed/enabled first
     * for ubuntu + apt:
     * apt-get install hugepages
     * you'll need to set it up, some good info if you don't know what you're 
     * doing is here: https://kerneltalks.com/services/what-is-huge-pages-in-linux/
     * you'll likely need to reboot to clear out any funky kernel states, once you're done,
     * write a test program and make sure that you're allocating, the command:
     * hugeadm --explain 
     * should tell you what's set up and in use.
     */
    out = mmap( ptr, 
                alloc_bytes, 
                ( PROT_READ | PROT_WRITE ), 
                MAP_SHARED, 
                fd, 
                0 );
    if( out == MAP_FAILED )
    {
#if USE_CPP_EXCEPTIONS==1      
       std::stringstream ss;
       ss << "Failed to mmap shm region with the following error: " << 
         std::strerror( errno ) << ",\n" << "unlinking.";
       shm_unlink( key );
       throw bad_shm_alloc( ss.str() );
#else
       shm_unlink( key );
       return( nullptr );
#endif
    }
/**
 * ###### END POSIX SECTION ######
 */
#elif _USE_SYSTEMV_SHM_ == 1
/**
 * ###### START SYSTEM-V SECTION  ######
 */
    /** first time you try to open it **/
    const auto shmid = 
        shmget( key, alloc_bytes, IPC_CREAT | IPC_EXCL | S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP );
    if( shmid == shm::failure ) 
    {
        //if using exceptions, you won't return from this
        return( handle_open_failure( key ) );
    }

    out  = shmat( shmid, nullptr, 0 );
    if( out == (void*)-1 )
    {
#if USE_CPP_EXCEPTIONS==1      
       std::stringstream ss;
       ss << "Failed to mmap shm region with the following error: " << 
         std::strerror( errno ) << ",\n" << "unlinking.";
       throw bad_shm_alloc( ss.str() );
#else
       return( nullptr );
#endif
    }


#endif /** end switch between posix/sysV **/    
    if( zero )
    {
       /* everything theoretically went well, lets initialize to zero */
       std::memset( out, 0x0, nbytes );
    }
    char *temp( reinterpret_cast< char* >( out ) );
    /** we allocate one extra page **/
    if( mprotect( (void*) &temp[ alloc_bytes - page_size ],
                   page_size, 
                   PROT_NONE ) != 0 )
    {
#if DEBUG   
      perror( "Error, failed to set page protection, not fatal just dangerous." );
#endif      
   }
   return( out );
}